

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O1

void nn_cws_destroy(void *self)

{
  nn_chunkref_term((nn_chunkref *)((long)self + 0x1c08));
  nn_chunkref_term((nn_chunkref *)((long)self + 0x1c28));
  nn_chunkref_term((nn_chunkref *)((long)self + 0x1c48));
  nn_dns_term((nn_dns *)((long)self + 0x1c80));
  nn_sws_term((nn_sws *)((long)self + 0x3c8));
  nn_backoff_term((nn_backoff *)((long)self + 0x2c8));
  nn_usock_term((nn_usock *)((long)self + 0x68));
  nn_fsm_term((nn_fsm *)self);
  nn_free(self);
  return;
}

Assistant:

static void nn_cws_destroy (void *self)
{
    struct nn_cws *cws = self;

    nn_chunkref_term (&cws->resource);
    nn_chunkref_term (&cws->remote_host);
    nn_chunkref_term (&cws->nic);
    nn_dns_term (&cws->dns);
    nn_sws_term (&cws->sws);
    nn_backoff_term (&cws->retry);
    nn_usock_term (&cws->usock);
    nn_fsm_term (&cws->fsm);

    nn_free (cws);
}